

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_messages.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  hrgls_Status hVar2;
  hrgls_MessageLevel hVar3;
  ostream *poVar4;
  char *pcVar5;
  size_type sVar6;
  reference copy;
  long lVar7;
  timeval tVar8;
  timeval tVar9;
  __time_t local_f8;
  timeval now_1;
  Message m;
  iterator __end3;
  iterator __begin3;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> *__range3;
  undefined1 local_c0 [4];
  hrgls_Status status_1;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> messages;
  timeval start_1;
  timeval now;
  timeval start;
  size_t count;
  hrgls_Status status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  string local_40 [32];
  API local_20;
  API api;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  api.m_private = (API_private *)argv;
  std::__cxx11::string::string(local_40,(string *)hrgls::ANONYMOUS_USER_abi_cxx11_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)hrgls::NO_CREDENTIALS);
  hrgls::API::API(&local_20,(string *)local_40,&local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_58);
  std::__cxx11::string::~string(local_40);
  hVar2 = hrgls::API::GetStatus(&local_20);
  if (hVar2 == 0) {
    start.tv_usec = 0;
    hrgls::API::SetLogMessageCallback(&local_20,HandleMessageCallback,&start.tv_usec);
    hVar2 = hrgls::API::GetStatus(&local_20);
    if (hVar2 == 0) {
      hrgls::API::SetLogMessageStreamingState(&local_20,true);
      hVar2 = hrgls::API::GetStatus(&local_20);
      if (hVar2 == 0) {
        tVar8 = hrgls::API::GetCurrentSystemTime(&local_20);
        start.tv_sec = tVar8.tv_usec;
        do {
          if (4 < (ulong)start.tv_usec) {
            hrgls::API::SetLogMessageStreamingState(&local_20,false);
            hVar2 = hrgls::API::GetStatus(&local_20);
            if (hVar2 != 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Could not set streaming state off: ");
              pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
              poVar4 = std::operator<<(poVar4,pcVar5);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = 5;
              goto LAB_00107e83;
            }
            hrgls::API::SetLogMessageCallback(&local_20,(LogMessageCallback)0x0,(void *)0x0);
            hVar2 = hrgls::API::GetStatus(&local_20);
            if (hVar2 != 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Could not reset callback handler: ");
              pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
              poVar4 = std::operator<<(poVar4,pcVar5);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = 6;
              goto LAB_00107e83;
            }
            hrgls::API::SetLogMessageMinimumLevel(&local_20,0);
            hVar2 = hrgls::API::GetStatus(&local_20);
            if (hVar2 != 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Could not set minimum message level: "
                                      );
              pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
              poVar4 = std::operator<<(poVar4,pcVar5);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = 100;
              goto LAB_00107e83;
            }
            hrgls::API::SetLogMessageStreamingState(&local_20,true);
            hVar2 = hrgls::API::GetStatus(&local_20);
            if (hVar2 != 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Could not set streaming state on: ");
              pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
              poVar4 = std::operator<<(poVar4,pcVar5);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = 7;
              goto LAB_00107e83;
            }
            start.tv_usec = 0;
            tVar8 = hrgls::API::GetCurrentSystemTime(&local_20);
            messages.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)tVar8.tv_sec;
            goto LAB_00107aad;
          }
          tVar9 = hrgls::API::GetCurrentSystemTime(&local_20);
        } while (tVar9.tv_sec - tVar8.tv_sec < 6);
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Timeout waiting for callback-based messages.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 4;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Could not set streaming state on: ");
        pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 3;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Could not set callback handler: ");
      pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 2;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Could not Open API: ");
    pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  goto LAB_00107e83;
  while ((ulong)start.tv_usec < 5) {
LAB_00107aad:
    hrgls::API::GetPendingLogMessages
              ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_c0,&local_20,0);
    hVar2 = hrgls::API::GetStatus(&local_20);
    if (hVar2 == 0) {
      sVar6 = std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::size
                        ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_c0);
      start.tv_usec = sVar6 + start.tv_usec;
      __end3 = std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::begin
                         ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_c0);
      m.m_private = (Message_private *)
                    std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::end
                              ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_c0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<hrgls::Message_*,_std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>_>
                                         *)&m), bVar1) {
        copy = __gnu_cxx::
               __normal_iterator<hrgls::Message_*,_std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>_>
               ::operator*(&__end3);
        hrgls::Message::Message((Message *)&now_1.tv_usec,copy);
        hVar3 = hrgls::Message::Level((Message *)&now_1.tv_usec);
        bVar1 = hVar3 < 0;
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Too-low message level: ");
          hVar3 = hrgls::Message::Level((Message *)&now_1.tv_usec);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,hVar3);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 0x65;
        }
        hrgls::Message::~Message((Message *)&now_1.tv_usec);
        tVar8.tv_usec = now_1.tv_sec;
        tVar8.tv_sec = local_f8;
        if (bVar1) goto LAB_00107d75;
        __gnu_cxx::
        __normal_iterator<hrgls::Message_*,_std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>_>
        ::operator++(&__end3);
      }
LAB_00107ce4:
      tVar8 = hrgls::API::GetCurrentSystemTime(&local_20);
      now_1.tv_sec = tVar8.tv_usec;
      lVar7 = tVar8.tv_sec;
      if (lVar7 - (long)messages.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage < 6) {
        bVar1 = false;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Timeout waiting for get-based messages.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        tVar8.tv_usec = now_1.tv_sec;
        tVar8.tv_sec = lVar7;
        argv_local._4_4_ = 9;
        bVar1 = true;
      }
    }
    else {
      if (hVar2 == 1) goto LAB_00107ce4;
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error reading messages: ");
      pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      tVar8.tv_usec = now_1.tv_sec;
      tVar8.tv_sec = local_f8;
      argv_local._4_4_ = 8;
      bVar1 = true;
    }
LAB_00107d75:
    now_1.tv_sec = tVar8.tv_usec;
    local_f8 = tVar8.tv_sec;
    std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector
              ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_c0);
    if (bVar1) goto LAB_00107e83;
  }
  hrgls::API::SetLogMessageStreamingState(&local_20,false);
  hVar2 = hrgls::API::GetStatus(&local_20);
  if (hVar2 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Success!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Could not set streaming state off: ");
    pcVar5 = (char *)hrgls_ErrorMessage(hVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 10;
  }
LAB_00107e83:
  hrgls::API::~API(&local_20);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
  // Get a base API object and, specifying default parameters.
  hrgls::API api;
  hrgls_Status status = api.GetStatus();
  if (status != hrgls_STATUS_OKAY) {
    std::cerr << "Could not Open API: "
      << hrgls_ErrorMessage(status) << std::endl;
    return 1;
  }

  size_t count = 0;
  { /// Read messages using a callback handler.

    // Set a callback handler for incoming messages and then start streaming.
    api.SetLogMessageCallback(HandleMessageCallback, &count);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set callback handler: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 2;
    }
    api.SetLogMessageStreamingState(true);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state on: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 3;
    }

    // Run until we have 5 messages or we time out.
    struct timeval start = api.GetCurrentSystemTime();
    while (count < 5) {
      struct timeval now = api.GetCurrentSystemTime();
      if (now.tv_sec - start.tv_sec > 5) {
        std::cerr << "Timeout waiting for callback-based messages." << std::endl;
        return 4;
      }
    };

    // Unhook the callback handler after stopping the stream.
    api.SetLogMessageStreamingState(false);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state off: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 5;
    }
    api.SetLogMessageCallback(nullptr, nullptr);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not reset callback handler: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 6;
    }
  }

  // Set a minimum threshold for the messages at warning for the
  // get-based test and ensure that we don't get any messages with
  // lower level than that.

  api.SetLogMessageMinimumLevel(hrgls_MESSAGE_MINIMUM_WARNING);
  status = api.GetStatus();
  if (status != hrgls_STATUS_OKAY) {
    std::cerr << "Could not set minimum message level: "
      << hrgls_ErrorMessage(status) << std::endl;
    return 100;
  }

  { /// Read the message without a callback handler.

    // Start streaming
    api.SetLogMessageStreamingState(true);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state on: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 7;
    }

    count = 0;
    struct timeval start = api.GetCurrentSystemTime();
    do {
      std::vector<hrgls::Message> messages = api.GetPendingLogMessages();
      hrgls_Status status = api.GetStatus();
      if (hrgls_STATUS_OKAY == status) {
        count += messages.size();
        // Make sure we didn't get any messages below the minimum level.
        for (auto m : messages) {
          if (m.Level() < hrgls_MESSAGE_MINIMUM_WARNING) {
            std::cerr << "Too-low message level: " << m.Level() << std::endl;
            return 101;
          }
        }
      } else if (status != hrgls_STATUS_TIMEOUT) {
        std::cerr << "Error reading messages: " << hrgls_ErrorMessage(status) << std::endl;
        return 8;
      }

      struct timeval now = api.GetCurrentSystemTime();
      if (now.tv_sec - start.tv_sec > 5) {
        std::cerr << "Timeout waiting for get-based messages." << std::endl;
        return 9;
      }

    } while (count < 5);

    // Stop streaming
    api.SetLogMessageStreamingState(false);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state off: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 10;
    }
  }

  std::cout << "Success!" << std::endl;
  return 0;
}